

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::FindPropertyIndex(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                    *this,ValueType *name,SizeType *outIndex)

{
  SizeType SVar1;
  SizeType SVar2;
  int iVar3;
  Ch *__s2;
  Ch *__s1;
  uint local_3c;
  SizeType index;
  Ch *str;
  SizeType len;
  SizeType *outIndex_local;
  ValueType *name_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  SVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetStringLength(name);
  __s2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetString(name);
  local_3c = 0;
  do {
    if (this->propertyCount_ <= local_3c) {
      return false;
    }
    SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
                      (&this->properties_[local_3c].name);
    if (SVar2 == SVar1) {
      __s1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                       (&this->properties_[local_3c].name);
      iVar3 = memcmp(__s1,__s2,(ulong)SVar1);
      if (iVar3 == 0) {
        *outIndex = local_3c;
        return true;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

bool FindPropertyIndex(const ValueType& name, SizeType* outIndex) const {
        SizeType len = name.GetStringLength();
        const Ch* str = name.GetString();
        for (SizeType index = 0; index < propertyCount_; index++)
            if (properties_[index].name.GetStringLength() == len &&
                (std::memcmp(properties_[index].name.GetString(), str, sizeof(Ch) * len) == 0))
            {
                *outIndex = index;
                return true;
            }
        return false;
    }